

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O0

void sysbvm_jit_x86_mov64IntoMemoryWithOffset
               (sysbvm_bytecodeJit_t *jit,sysbvm_x86_register_t destination,int32_t offset,
               sysbvm_x86_register_t source)

{
  uint8_t reg;
  uint8_t uVar1;
  uint8_t local_32 [3];
  uint8_t local_2f;
  uint8_t local_2e;
  uint8_t local_2d;
  uint8_t local_2c;
  uint8_t local_2b;
  uint8_t instruction_3 [7];
  uint8_t instruction_2 [8];
  uint8_t instruction_1 [3];
  uint8_t instruction [4];
  sysbvm_x86_register_t source_local;
  int32_t offset_local;
  sysbvm_x86_register_t destination_local;
  sysbvm_bytecodeJit_t *jit_local;
  uint8_t uVar2;
  uint8_t uVar3;
  
  reg = (uint8_t)destination;
  unique0x10000195 = source;
  if ((offset == 0) && ((destination & SYSBVM_X86_64_ARG0) != SYSBVM_X86_EBP)) {
    if ((destination & SYSBVM_X86_64_ARG0) == SYSBVM_X86_ESP) {
      instruction_2[3] =
           sysbvm_jit_x86_rex(true,SYSBVM_X86_64_ARG0 < source,false,
                              SYSBVM_X86_64_ARG0 < destination);
      instruction_2[4] = 0x89;
      instruction_2[5] = sysbvm_jit_x86_sibOnlyBase(reg);
      instruction_2[6] = sysbvm_jit_x86_modRM(reg,(uint8_t)stack0xffffffffffffffe4,'\0');
      sysbvm_bytecodeJit_addBytes(jit,4,instruction_2 + 3);
    }
    else {
      instruction_2[0] =
           sysbvm_jit_x86_rex(true,SYSBVM_X86_64_ARG0 < source,false,
                              SYSBVM_X86_64_ARG0 < destination);
      instruction_2[1] = 0x89;
      instruction_2[2] = sysbvm_jit_x86_modRM(reg,(uint8_t)stack0xffffffffffffffe4,'\0');
      sysbvm_bytecodeJit_addBytes(jit,3,instruction_2);
    }
  }
  else {
    uVar1 = (uint8_t)((uint)offset >> 8);
    uVar2 = (uint8_t)((uint)offset >> 0x10);
    uVar3 = (uint8_t)((uint)offset >> 0x18);
    if ((destination & SYSBVM_X86_64_ARG0) == SYSBVM_X86_ESP) {
      local_2b = sysbvm_jit_x86_rex(true,SYSBVM_X86_64_ARG0 < source,false,
                                    SYSBVM_X86_64_ARG0 < destination);
      instruction_3[0] = 0x89;
      instruction_3[1] = sysbvm_jit_x86_modRM(reg,(uint8_t)stack0xffffffffffffffe4,'\x02');
      instruction_3[2] = sysbvm_jit_x86_sibOnlyBase(reg);
      instruction_3[3] = (uint8_t)offset;
      instruction_3[4] = uVar1;
      instruction_3[5] = uVar2;
      instruction_3[6] = uVar3;
      sysbvm_bytecodeJit_addBytes(jit,8,&local_2b);
    }
    else {
      local_32[0] = sysbvm_jit_x86_rex(true,SYSBVM_X86_64_ARG0 < source,false,
                                       SYSBVM_X86_64_ARG0 < destination);
      local_32[1] = 0x89;
      local_32[2] = sysbvm_jit_x86_modRM(reg,(uint8_t)stack0xffffffffffffffe4,'\x02');
      local_2f = (uint8_t)offset;
      local_2e = uVar1;
      local_2d = uVar2;
      local_2c = uVar3;
      sysbvm_bytecodeJit_addBytes(jit,7,local_32);
    }
  }
  return;
}

Assistant:

static void sysbvm_jit_x86_mov64IntoMemoryWithOffset(sysbvm_bytecodeJit_t *jit, sysbvm_x86_register_t destination, int32_t offset, sysbvm_x86_register_t source)
{
    if(offset == 0 && (destination & SYSBVM_X86_REG_HALF_MASK) != SYSBVM_X86_RBP)
    {
        if((destination & SYSBVM_X86_REG_HALF_MASK) == SYSBVM_X86_RSP)
        {
            uint8_t instruction[] = {
                sysbvm_jit_x86_rex(true, source > SYSBVM_X86_REG_HALF_MASK, false, destination > SYSBVM_X86_REG_HALF_MASK),
                0x89,
                sysbvm_jit_x86_sibOnlyBase(destination),
                sysbvm_jit_x86_modRM(destination, source, 0),
            };

            sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);            
        }
        else
        {
            uint8_t instruction[] = {
                sysbvm_jit_x86_rex(true, source > SYSBVM_X86_REG_HALF_MASK, false, destination > SYSBVM_X86_REG_HALF_MASK),
                0x89,
                sysbvm_jit_x86_modRM(destination, source, 0),
            };

            sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);            
        }
    }
    else
    {
        if((destination & SYSBVM_X86_REG_HALF_MASK) == SYSBVM_X86_RSP)
        {
            uint8_t instruction[] = {
                sysbvm_jit_x86_rex(true, source > SYSBVM_X86_REG_HALF_MASK, false, destination > SYSBVM_X86_REG_HALF_MASK),
                0x89,
                sysbvm_jit_x86_modRM(destination, source, 2),
                sysbvm_jit_x86_sibOnlyBase(destination),
                offset & 0xFF, (offset >> 8) & 0xFF, (offset >> 16) & 0xFF, (offset >> 24) & 0xFF,
            };

            sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
        }
        else
        {
            uint8_t instruction[] = {
                sysbvm_jit_x86_rex(true, source > SYSBVM_X86_REG_HALF_MASK, false, destination > SYSBVM_X86_REG_HALF_MASK),
                0x89,
                sysbvm_jit_x86_modRM(destination, source, 2),
                offset & 0xFF, (offset >> 8) & 0xFF, (offset >> 16) & 0xFF, (offset >> 24) & 0xFF,
            };

            sysbvm_bytecodeJit_addBytes(jit, sizeof(instruction), instruction);
        }
    }
}